

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityPrintExpectedAndActualStringsLen(char *expected,char *actual,UNITY_UINT32 length)

{
  UnityPrint(" Expected ");
  if (expected == (char *)0x0) {
    UnityPrint("NULL");
  }
  else {
    putchar(0x27);
    UnityPrintLen(expected,length);
    putchar(0x27);
  }
  UnityPrint(" Was ");
  if (actual != (char *)0x0) {
    putchar(0x27);
    UnityPrintLen(actual,length);
    putchar(0x27);
    return;
  }
  UnityPrint("NULL");
  return;
}

Assistant:

static void UnityPrintExpectedAndActualStringsLen(const char* expected,
                                                  const char* actual,
                                                  const UNITY_UINT32 length)
{
    UnityPrint(UnityStrExpected);
    if (expected != NULL)
    {
        UNITY_OUTPUT_CHAR('\'');
        UnityPrintLen(expected, length);
        UNITY_OUTPUT_CHAR('\'');
    }
    else
    {
        UnityPrint(UnityStrNull);
    }
    UnityPrint(UnityStrWas);
    if (actual != NULL)
    {
        UNITY_OUTPUT_CHAR('\'');
        UnityPrintLen(actual, length);
        UNITY_OUTPUT_CHAR('\'');
    }
    else
    {
        UnityPrint(UnityStrNull);
    }
}